

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

void wcsdump(char *e,wchar_t *w)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  wchar_t *pwStack_18;
  uint c;
  wchar_t *w_local;
  char *e_local;
  
  logprintf("      %s = ",e);
  if (w == (wchar_t *)0x0) {
    logprintf("(null)");
  }
  else {
    logprintf("\"");
    pwStack_18 = w;
    while (*pwStack_18 != L'\0') {
      pwVar2 = pwStack_18 + 1;
      wVar1 = *pwStack_18;
      pwStack_18 = pwVar2;
      if (((uint)wVar1 < 0x20) || (0x7e < (uint)wVar1)) {
        if ((uint)wVar1 < 0x100) {
          logprintf("\\x%02X",(ulong)(uint)wVar1);
        }
        else if ((uint)wVar1 < 0x10000) {
          logprintf("\\u%04X",(ulong)(uint)wVar1);
        }
        else {
          logprintf("\\U%08X",(ulong)(uint)wVar1);
        }
      }
      else {
        logprintf("%c",(ulong)(uint)wVar1);
      }
    }
    logprintf("\"\n");
  }
  return;
}

Assistant:

static void
wcsdump(const char *e, const wchar_t *w)
{
	logprintf("      %s = ", e);
	if (w == NULL) {
		logprintf("(null)");
		return;
	}
	logprintf("\"");
	while (*w != L'\0') {
		unsigned int c = *w++;
		if (c >= 32 && c < 127)
			logprintf("%c", (int)c);
		else if (c < 256)
			logprintf("\\x%02X", c);
		else if (c < 0x10000)
			logprintf("\\u%04X", c);
		else
			logprintf("\\U%08X", c);
	}
	logprintf("\"\n");
}